

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall
fmt::v8::detail::format_error_code
          (detail *this,buffer<char> *out,int error_code,string_view message)

{
  string_view fmt;
  string_view fmt_00;
  bool bVar1;
  int value;
  type tVar2;
  size_t sVar3;
  undefined4 in_register_00000014;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_1d0;
  buffer_appender<char> it;
  long lStack_1c0;
  uint32_or_64_or_128_t<int> abs_value;
  size_t error_code_size;
  buffer<char> *pbStack_1b0;
  int error_code_local;
  buffer<char> *out_local;
  string_view message_local;
  format_args local_170;
  char *local_160;
  size_t local_158;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_150;
  char *local_148;
  v8 *local_140;
  char *local_138;
  undefined8 uStack_130;
  buffer<char> *local_128;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_120;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> local_118;
  format_args local_f8;
  char *local_e8;
  size_t local_e0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_d8;
  char (*local_d0) [7];
  char *local_c8;
  char *local_c0;
  undefined8 uStack_b8;
  buffer<char> *local_b0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_a8;
  char **local_a0;
  char *local_98;
  size_t sStack_90;
  size_t *local_80;
  format_args *local_78;
  size_t *local_70;
  undefined8 local_68;
  format_args *local_60;
  size_t *local_58;
  char **local_50;
  char *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> *local_38;
  format_args *local_30;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> *local_28;
  undefined8 local_20;
  format_args *local_18;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> *local_10;
  
  out_local = (buffer<char> *)CONCAT44(in_register_00000014,error_code);
  message_local.data_ = message.data_;
  error_code_size._4_4_ = (uint32_t)out;
  pbStack_1b0 = (buffer<char> *)this;
  buffer<char>::try_resize((buffer<char> *)this,0);
  lStack_1c0 = 8;
  it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ =
       error_code_size._4_4_;
  bVar1 = is_negative<int,_0>(error_code_size._4_4_);
  if (bVar1) {
    it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ =
         -it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_;
    lStack_1c0 = 9;
  }
  value = count_digits(it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_
                      );
  tVar2 = to_unsigned<int>(value);
  appender::back_insert_iterator((appender *)&local_1d0,pbStack_1b0);
  sVar3 = basic_string_view<char>::size((basic_string_view<char> *)&out_local);
  if (sVar3 <= 500 - (lStack_1c0 + (ulong)tVar2)) {
    local_128 = local_1d0.container;
    local_138 = "{}{}";
    uStack_130 = 4;
    local_140 = (v8 *)&out_local;
    local_148 = ": ";
    local_150.container = local_1d0.container;
    local_a0 = &local_138;
    local_160 = "{}{}";
    local_158 = 4;
    local_98 = local_160;
    sStack_90 = local_158;
    make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,fmt::v8::basic_string_view<char>&,char_const(&)[3]>
              ((format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_fmt::v8::basic_string_view<char>,_char[3]>
                *)&message_local.size_,local_140,(basic_string_view<char> *)": ",
               (char (*) [3])"{}{}");
    local_78 = &local_170;
    local_80 = &message_local.size_;
    local_68 = 0xcd;
    local_170.desc_ = 0xcd;
    local_170.field_1.values_ =
         (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_80;
    fmt.size_ = local_158;
    fmt.data_ = local_160;
    local_70 = local_80;
    local_60 = local_78;
    local_58 = local_80;
    local_120.container =
         (buffer<char> *)vformat_to<fmt::v8::appender,_0>(local_150.container,fmt,local_170);
  }
  local_b0 = local_1d0.container;
  local_c0 = "{}{}";
  uStack_b8 = 4;
  local_c8 = "error ";
  local_d0 = (char (*) [7])((long)&error_code_size + 4);
  local_d8.container = local_1d0.container;
  local_50 = &local_c0;
  local_e8 = "{}{}";
  local_e0 = 4;
  local_48 = local_e8;
  sStack_40 = local_e0;
  make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,char_const(&)[7],int&>
            (&local_118,(v8 *)"error ",local_d0,(int *)"{}{}");
  local_30 = &local_f8;
  local_38 = &local_118;
  local_20 = 0x1c;
  local_f8.desc_ = 0x1c;
  local_f8.field_1.values_ =
       (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_38;
  fmt_00.size_ = local_e0;
  fmt_00.data_ = local_e8;
  local_28 = local_38;
  local_18 = local_30;
  local_10 = local_38;
  local_a8.container =
       (buffer<char> *)vformat_to<fmt::v8::appender,_0>(local_d8.container,fmt_00,local_f8);
  sVar3 = buffer<char>::size(pbStack_1b0);
  if (500 < sVar3) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format-inl.h"
                ,0x50,"");
  }
  return;
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = buffer_appender<char>(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    format_to(it, FMT_STRING("{}{}"), message, SEP);
  format_to(it, FMT_STRING("{}{}"), ERROR_STR, error_code);
  FMT_ASSERT(out.size() <= inline_buffer_size, "");
}